

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O0

Vec_Int_t * Abc_ManReadBinary(char *pFileName,char *pToken)

{
  Vec_Str_t *p;
  char *pcVar1;
  size_t sVar2;
  int local_3c;
  int Length;
  int i;
  char *pStr;
  Vec_Str_t *vStr;
  Vec_Int_t *vMap;
  char *pToken_local;
  char *pFileName_local;
  
  vStr = (Vec_Str_t *)0x0;
  p = Abc_ManReadFile(pFileName);
  if (p == (Vec_Str_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    pcVar1 = Vec_StrArray(p);
    pcVar1 = strstr(pcVar1,pToken);
    if (pcVar1 != (char *)0x0) {
      sVar2 = strlen(pToken);
      pcVar1 = pcVar1 + sVar2;
      vStr = (Vec_Str_t *)Vec_IntAlloc(100);
      sVar2 = strlen(pcVar1);
      for (local_3c = 0; local_3c < (int)sVar2; local_3c = local_3c + 1) {
        if ((pcVar1[local_3c] == '0') || (pcVar1[local_3c] == '?')) {
          Vec_IntPush((Vec_Int_t *)vStr,0);
        }
        else if (pcVar1[local_3c] == '1') {
          Vec_IntPush((Vec_Int_t *)vStr,1);
        }
        if ((('`' < pcVar1[local_3c]) && (pcVar1[local_3c] < '{')) ||
           (('@' < pcVar1[local_3c] && (pcVar1[local_3c] < '[')))) break;
      }
    }
    Vec_StrFree(p);
    pFileName_local = (char *)vStr;
  }
  return (Vec_Int_t *)pFileName_local;
}

Assistant:

Vec_Int_t * Abc_ManReadBinary( char * pFileName, char * pToken )
{
    Vec_Int_t * vMap = NULL;
    Vec_Str_t * vStr;
    char * pStr;
    int i, Length;
    vStr = Abc_ManReadFile( pFileName );
    if ( vStr == NULL )
        return NULL;
    pStr = Vec_StrArray( vStr );
    pStr = strstr( pStr, pToken );
    if ( pStr != NULL )
    {
        pStr  += strlen( pToken );
        vMap   = Vec_IntAlloc( 100 );
        Length = strlen( pStr );
        for ( i = 0; i < Length; i++ )
        {
            if ( pStr[i] == '0' || pStr[i] == '?' )
                Vec_IntPush( vMap, 0 );
            else if ( pStr[i] == '1' )
                Vec_IntPush( vMap, 1 );
            if ( ('a' <= pStr[i] && pStr[i] <= 'z') || 
                 ('A' <= pStr[i] && pStr[i] <= 'Z') )
                break;
        }
    }
    Vec_StrFree( vStr );
    return vMap;
}